

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix3.hpp
# Opt level: O3

void __thiscall
OpenMD::SquareMatrix3<double>::setupRotMat
          (SquareMatrix3<double> *this,double w,double x,double y,double z)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  long lVar3;
  Quaternion<double> q;
  SquareMatrix<double,_3> local_78;
  Quaternion<double> local_30;
  
  local_30.super_Vector<double,_4U>.data_[0] = w;
  local_30.super_Vector<double,_4U>.data_[1] = x;
  local_30.super_Vector<double,_4U>.data_[2] = y;
  local_30.super_Vector<double,_4U>.data_[3] = z;
  Quaternion<double>::toRotationMatrix3(&local_78,&local_30);
  if (&local_78 != &this->super_SquareMatrix<double,_3>) {
    lVar3 = 0;
    do {
      *(undefined8 *)
       ((long)(this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0] +
       lVar3 + 0x10) =
           *(undefined8 *)((long)local_78.super_RectMatrix<double,_3U,_3U>.data_[0] + lVar3 + 0x10);
      uVar2 = *(undefined8 *)((long)local_78.super_RectMatrix<double,_3U,_3U>.data_[0] + lVar3 + 8);
      puVar1 = (undefined8 *)
               ((long)(this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_
                      [0] + lVar3);
      *puVar1 = *(undefined8 *)((long)local_78.super_RectMatrix<double,_3U,_3U>.data_[0] + lVar3);
      puVar1[1] = uVar2;
      lVar3 = lVar3 + 0x18;
    } while (lVar3 != 0x48);
  }
  return;
}

Assistant:

void setupRotMat(Real w, Real x, Real y, Real z) {
      Quaternion<Real> q(w, x, y, z);
      *this = q.toRotationMatrix3();
    }